

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

bool duckdb::EdgeConnects(FilterInfoWithTotalDomains *edge,Subgraph2Denominator *subgraph)

{
  JoinRelationSet *pJVar1;
  FilterInfo *pFVar2;
  bool bVar3;
  
  optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&edge->filter_info);
  if ((((edge->filter_info).ptr)->left_set).ptr != (JoinRelationSet *)0x0) {
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&subgraph->relations);
    pJVar1 = (subgraph->relations).ptr;
    optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&edge->filter_info);
    pFVar2 = (edge->filter_info).ptr;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar2->left_set);
    bVar3 = JoinRelationSet::IsSubset(pJVar1,(pFVar2->left_set).ptr);
    if (bVar3) {
      return true;
    }
  }
  optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&edge->filter_info);
  if ((((edge->filter_info).ptr)->right_set).ptr != (JoinRelationSet *)0x0) {
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&subgraph->relations);
    pJVar1 = (subgraph->relations).ptr;
    optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&edge->filter_info);
    pFVar2 = (edge->filter_info).ptr;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar2->right_set);
    bVar3 = JoinRelationSet::IsSubset(pJVar1,(pFVar2->right_set).ptr);
    if (bVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EdgeConnects(FilterInfoWithTotalDomains &edge, Subgraph2Denominator &subgraph) {
	if (edge.filter_info->left_set) {
		if (JoinRelationSet::IsSubset(*subgraph.relations, *edge.filter_info->left_set)) {
			// cool
			return true;
		}
	}
	if (edge.filter_info->right_set) {
		if (JoinRelationSet::IsSubset(*subgraph.relations, *edge.filter_info->right_set)) {
			return true;
		}
	}
	return false;
}